

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,exr_const_context_t ctxt,
          exr_const_priv_part_t part)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  exr_attr_chlist_t *peVar6;
  exr_attr_chlist_entry_t *peVar7;
  uint uVar8;
  int iVar9;
  exr_result_t eVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint16_t *puVar16;
  exr_coding_channel_info_t *local_48;
  
  peVar6 = (part->channels->field_6).chlist;
  iVar1 = peVar6->num_channels;
  lVar12 = (long)iVar1;
  local_48 = builtinextras;
  if (5 < lVar12) {
    local_48 = (exr_coding_channel_info_t *)(*ctxt->alloc_fn)(lVar12 * 0x30);
    if (local_48 == (exr_coding_channel_info_t *)0x0) {
      eVar10 = (*ctxt->standard_error)(ctxt,1);
      return eVar10;
    }
    memset(local_48,0,lVar12 * 0x30);
  }
  if (0 < iVar1) {
    peVar7 = peVar6->entries;
    iVar2 = cinfo->start_y;
    uVar3 = cinfo->height;
    uVar15 = (iVar2 + uVar3) - 1;
    uVar8 = 1 - (iVar2 + uVar3);
    if (0 < (int)(iVar2 + uVar3)) {
      uVar8 = uVar15;
    }
    iVar4 = cinfo->width;
    puVar16 = &local_48->user_data_type;
    lVar13 = 0;
    do {
      ((exr_coding_channel_info_t *)(puVar16 + -0xf))->channel_name =
           *(char **)(peVar7->reserved + lVar13 + -0xd);
      uVar5 = *(uint *)(peVar7->reserved + lVar13 + 7);
      uVar14 = uVar3;
      if (1 < (int)uVar5) {
        iVar11 = iVar2 % (int)uVar5;
        if (uVar3 == 1) {
          uVar14 = (uint)(iVar11 == 0);
        }
        else {
          iVar9 = uVar5 - iVar11;
          if (iVar11 == 0) {
            iVar9 = 0;
          }
          uVar14 = 0;
          iVar11 = uVar15 - uVar8 % uVar5;
          if (iVar9 + iVar2 <= iVar11) {
            uVar14 = (iVar11 - (iVar9 + iVar2)) / (int)uVar5 + 1;
          }
        }
      }
      *(uint *)(puVar16 + -0xb) = uVar14;
      iVar11 = *(int *)(peVar7->reserved + lVar13 + 3);
      iVar9 = 1;
      if (iVar11 < 2) {
        iVar9 = iVar4;
      }
      if (1 < iVar11 && iVar4 != 1) {
        iVar9 = iVar4 / iVar11;
      }
      *(int *)(puVar16 + -9) = iVar9;
      *(int *)(puVar16 + -7) = iVar11;
      *(uint *)(puVar16 + -5) = uVar5;
      *(uint8_t *)(puVar16 + -3) = peVar7->reserved[lVar13 + -1];
      iVar11 = *(int *)(peVar7->reserved + lVar13 + -5);
      *(char *)((long)puVar16 + -5) = (iVar11 != 1) * '\x02' + '\x02';
      puVar16[-2] = (uint16_t)iVar11;
      puVar16[-1] = (ushort)(iVar11 != 1) * 2 + 2;
      *puVar16 = (uint16_t)iVar11;
      puVar16 = puVar16 + 0x18;
      lVar13 = lVar13 + 0x20;
    } while (lVar12 << 5 != lVar13);
  }
  *channels = local_48;
  *num_chans = (int16_t)iVar1;
  return 0;
}

Assistant:

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t** channels,
    int16_t*                    num_chans,
    exr_coding_channel_info_t*  builtinextras,
    const exr_chunk_info_t*     cinfo,
    exr_const_context_t         ctxt,
    exr_const_priv_part_t       part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = ctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_height (
            cinfo->height, curc->y_sampling, cinfo->start_y);
        decc->width = compute_sampled_width (
            cinfo->width, curc->x_sampling, cinfo->start_x);

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}